

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::List>::matchValue<mathiu::impl::List_const&>
          (Id<mathiu::impl::List> *this,List *v)

{
  bool bVar1;
  List *lhs;
  IdBlockBase<mathiu::impl::List> *this_00;
  ValueVariant<mathiu::impl::List> *pVVar2;
  List *v_local;
  Id<mathiu::impl::List> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::List>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::List>;
    pVVar2 = IdBlockBase<mathiu::impl::List>::variant(this_00);
    IdUtil<mathiu::impl::List>::bindValue<mathiu::impl::List_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }